

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O1

void __thiscall wasm::StackSignature::StackSignature(StackSignature *this,Expression *expr)

{
  uintptr_t uVar1;
  void *pvVar2;
  StackSignature *pSVar3;
  pointer pTVar4;
  Index IVar5;
  size_t sVar6;
  Expression ***pppEVar7;
  uintptr_t uVar8;
  Index IVar9;
  Type *this_00;
  Index index;
  Type local_a0;
  StackSignature *local_98;
  Expression *local_90;
  AbstractChildIterator<wasm::ValueChildIterator> local_88;
  undefined1 auStack_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> inputs;
  
  (this->params).id = 0;
  (this->results).id = 0;
  auStack_48 = (undefined1  [8])0x0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_98 = this;
  local_90 = expr;
  AbstractChildIterator<wasm::ValueChildIterator>::AbstractChildIterator(&local_88,expr);
  IVar9 = (int)((ulong)((long)local_88.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.children.flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) +
          (int)local_88.children.usedFixed;
  if (IVar9 != 0) {
    index = 0;
    do {
      IVar5 = AbstractChildIterator<wasm::ValueChildIterator>::mapIndex(&local_88,index);
      pTVar4 = inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pppEVar7 = local_88.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar5 - 4);
      if (IVar5 < 4) {
        pppEVar7 = local_88.children.fixed._M_elems + IVar5;
      }
      if (((**pppEVar7)->type).id < 2) {
        __assert_fail("child->type.isConcrete()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/stack-utils.cpp"
                      ,0x3e,"wasm::StackSignature::StackSignature(Expression *)");
      }
      this_00 = &(**pppEVar7)->type;
      sVar6 = wasm::Type::size(this_00);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_range_insert<wasm::Type::Iterator>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,pTVar4,this_00,0,
                 this_00,sVar6);
      index = index + 1;
    } while (IVar9 != index);
  }
  if (local_88.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Tuple::Tuple((Tuple *)&local_88,(TypeList *)auStack_48);
  pSVar3 = local_98;
  wasm::Type::Type(&local_a0,(Tuple *)&local_88);
  (pSVar3->params).id = local_a0.id;
  pvVar2 = (void *)CONCAT44(local_88.children.usedFixed._4_4_,(int)local_88.children.usedFixed);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_88.children.fixed._M_elems[1] - (long)pvVar2);
  }
  uVar1 = (local_90->type).id;
  uVar8 = 0;
  if (uVar1 != 1) {
    uVar8 = uVar1;
  }
  pSVar3->kind = (uint)(uVar1 == 1);
  (pSVar3->results).id = uVar8;
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return;
}

Assistant:

StackSignature::StackSignature(Expression* expr) {
  std::vector<Type> inputs;
  for (auto* child : ValueChildIterator(expr)) {
    assert(child->type.isConcrete());
    // Children might be tuple pops, so expand their types
    inputs.insert(inputs.end(), child->type.begin(), child->type.end());
  }
  params = Type(inputs);
  if (expr->type == Type::unreachable) {
    kind = Polymorphic;
    results = Type::none;
  } else {
    kind = Fixed;
    results = expr->type;
  }
}